

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathReleaseObject(xmlXPathContextPtr ctxt,xmlXPathObjectPtr obj)

{
  long *plVar1;
  xmlNodeSetPtr pxVar2;
  xmlNodePtr ns;
  int iVar3;
  xmlPointerListPtr pxVar4;
  xmlNodePtr node;
  int i;
  xmlNodeSetPtr tmpset;
  xmlXPathContextCachePtr cache;
  xmlXPathObjectPtr obj_local;
  xmlXPathContextPtr ctxt_local;
  
  if (obj == (xmlXPathObjectPtr)0x0) {
    return;
  }
  if ((ctxt == (xmlXPathContextPtr)0x0) || (ctxt->cache == (void *)0x0)) {
    xmlXPathFreeObject(obj);
    return;
  }
  plVar1 = (long *)ctxt->cache;
  switch(obj->type) {
  case XPATH_NODESET:
  case XPATH_XSLT_TREE:
    if (obj->nodesetval != (xmlNodeSetPtr)0x0) {
      if (obj->boolval == 0) {
        if ((obj->nodesetval->nodeMax < 0x29) &&
           ((*plVar1 == 0 || (*(int *)(*plVar1 + 8) < (int)plVar1[5])))) {
          if (*plVar1 == 0) {
            pxVar4 = xmlPointerListCreate(10);
            *plVar1 = (long)pxVar4;
            if (*plVar1 == 0) goto LAB_0024919a;
          }
          iVar3 = xmlPointerListAddSize((xmlPointerListPtr)*plVar1,obj,0);
          goto joined_r0x00248fb5;
        }
        xmlXPathFreeNodeSet(obj->nodesetval);
        obj->nodesetval = (xmlNodeSetPtr)0x0;
      }
      else {
        obj->type = XPATH_XSLT_TREE;
        xmlXPathFreeValueTree(obj->nodesetval);
        obj->nodesetval = (xmlNodeSetPtr)0x0;
      }
    }
    break;
  case XPATH_BOOLEAN:
    if ((plVar1[2] != 0) && ((int)plVar1[6] <= *(int *)(plVar1[2] + 8))) break;
    if (plVar1[2] == 0) {
      pxVar4 = xmlPointerListCreate(10);
      plVar1[2] = (long)pxVar4;
      if (plVar1[2] == 0) goto LAB_0024919a;
    }
    iVar3 = xmlPointerListAddSize((xmlPointerListPtr)plVar1[2],obj,0);
    goto joined_r0x00248fb5;
  case XPATH_NUMBER:
    if ((plVar1[3] == 0) || (*(int *)(plVar1[3] + 8) < *(int *)((long)plVar1 + 0x34))) {
      if (plVar1[3] == 0) {
        pxVar4 = xmlPointerListCreate(10);
        plVar1[3] = (long)pxVar4;
        if (plVar1[3] == 0) goto LAB_0024919a;
      }
      iVar3 = xmlPointerListAddSize((xmlPointerListPtr)plVar1[3],obj,0);
      goto joined_r0x00248fb5;
    }
    break;
  case XPATH_STRING:
    if (obj->stringval != (xmlChar *)0x0) {
      (*xmlFree)(obj->stringval);
    }
    if ((plVar1[1] == 0) || (*(int *)(plVar1[1] + 8) < *(int *)((long)plVar1 + 0x2c))) {
      if (plVar1[1] == 0) {
        pxVar4 = xmlPointerListCreate(10);
        plVar1[1] = (long)pxVar4;
        if (plVar1[1] == 0) goto LAB_0024919a;
      }
      iVar3 = xmlPointerListAddSize((xmlPointerListPtr)plVar1[1],obj,0);
      goto joined_r0x00248fb5;
    }
    break;
  default:
    goto LAB_0024919a;
  }
  if ((plVar1[4] == 0) || (*(int *)(plVar1[4] + 8) < (int)plVar1[7])) {
    if (plVar1[4] == 0) {
      pxVar4 = xmlPointerListCreate(10);
      plVar1[4] = (long)pxVar4;
      if (plVar1[4] == 0) goto LAB_0024919a;
    }
    iVar3 = xmlPointerListAddSize((xmlPointerListPtr)plVar1[4],obj,0);
joined_r0x00248fb5:
    if (iVar3 != -1) {
      if (obj->nodesetval != (xmlNodeSetPtr)0x0) {
        pxVar2 = obj->nodesetval;
        if (pxVar2->nodeNr < 2) {
          if (((pxVar2->nodeNr == 1) && (*pxVar2->nodeTab != (xmlNodePtr)0x0)) &&
             ((*pxVar2->nodeTab)->type == XML_NAMESPACE_DECL)) {
            xmlXPathNodeSetFreeNs((xmlNsPtr)*pxVar2->nodeTab);
          }
        }
        else {
          for (node._4_4_ = 0; node._4_4_ < pxVar2->nodeNr; node._4_4_ = node._4_4_ + 1) {
            ns = pxVar2->nodeTab[node._4_4_];
            if ((ns != (xmlNodePtr)0x0) && (ns->type == XML_NAMESPACE_DECL)) {
              xmlXPathNodeSetFreeNs((xmlNsPtr)ns);
            }
          }
        }
        pxVar2->nodeNr = 0;
        memset(obj,0,0x48);
        obj->nodesetval = pxVar2;
        return;
      }
      memset(obj,0,0x48);
      return;
    }
  }
LAB_0024919a:
  if (obj->nodesetval != (xmlNodeSetPtr)0x0) {
    xmlXPathFreeNodeSet(obj->nodesetval);
  }
  (*xmlFree)(obj);
  return;
}

Assistant:

static void
xmlXPathReleaseObject(xmlXPathContextPtr ctxt, xmlXPathObjectPtr obj)
{
#define XP_CACHE_ADD(sl, o) if (sl == NULL) { \
	sl = xmlPointerListCreate(10); if (sl == NULL) goto free_obj; } \
    if (xmlPointerListAddSize(sl, obj, 0) == -1) goto free_obj;

#define XP_CACHE_WANTS(sl, n) ((sl == NULL) || ((sl)->number < n))

    if (obj == NULL)
	return;
    if ((ctxt == NULL) || (ctxt->cache == NULL)) {
	 xmlXPathFreeObject(obj);
    } else {
	xmlXPathContextCachePtr cache =
	    (xmlXPathContextCachePtr) ctxt->cache;

	switch (obj->type) {
	    case XPATH_NODESET:
	    case XPATH_XSLT_TREE:
		if (obj->nodesetval != NULL) {
		    if (obj->boolval) {
			/*
			* It looks like the @boolval is used for
			* evaluation if this an XSLT Result Tree Fragment.
			* TODO: Check if this assumption is correct.
			*/
			obj->type = XPATH_XSLT_TREE; /* just for debugging */
			xmlXPathFreeValueTree(obj->nodesetval);
			obj->nodesetval = NULL;
		    } else if ((obj->nodesetval->nodeMax <= 40) &&
			(XP_CACHE_WANTS(cache->nodesetObjs,
					cache->maxNodeset)))
		    {
			XP_CACHE_ADD(cache->nodesetObjs, obj);
			goto obj_cached;
		    } else {
			xmlXPathFreeNodeSet(obj->nodesetval);
			obj->nodesetval = NULL;
		    }
		}
		break;
	    case XPATH_STRING:
		if (obj->stringval != NULL)
		    xmlFree(obj->stringval);

		if (XP_CACHE_WANTS(cache->stringObjs, cache->maxString)) {
		    XP_CACHE_ADD(cache->stringObjs, obj);
		    goto obj_cached;
		}
		break;
	    case XPATH_BOOLEAN:
		if (XP_CACHE_WANTS(cache->booleanObjs, cache->maxBoolean)) {
		    XP_CACHE_ADD(cache->booleanObjs, obj);
		    goto obj_cached;
		}
		break;
	    case XPATH_NUMBER:
		if (XP_CACHE_WANTS(cache->numberObjs, cache->maxNumber)) {
		    XP_CACHE_ADD(cache->numberObjs, obj);
		    goto obj_cached;
		}
		break;
#ifdef LIBXML_XPTR_LOCS_ENABLED
	    case XPATH_LOCATIONSET:
		if (obj->user != NULL) {
		    xmlXPtrFreeLocationSet(obj->user);
		}
		goto free_obj;
#endif
	    default:
		goto free_obj;
	}

	/*
	* Fallback to adding to the misc-objects slot.
	*/
	if (XP_CACHE_WANTS(cache->miscObjs, cache->maxMisc)) {
	    XP_CACHE_ADD(cache->miscObjs, obj);
	} else
	    goto free_obj;

obj_cached:

#ifdef XP_DEBUG_OBJ_USAGE
	xmlXPathDebugObjUsageReleased(ctxt, obj->type);
#endif

	if (obj->nodesetval != NULL) {
	    xmlNodeSetPtr tmpset = obj->nodesetval;

	    /*
	    * TODO: Due to those nasty ns-nodes, we need to traverse
	    *  the list and free the ns-nodes.
	    * URGENT TODO: Check if it's actually slowing things down.
	    *  Maybe we shouldn't try to preserve the list.
	    */
	    if (tmpset->nodeNr > 1) {
		int i;
		xmlNodePtr node;

		for (i = 0; i < tmpset->nodeNr; i++) {
		    node = tmpset->nodeTab[i];
		    if ((node != NULL) &&
			(node->type == XML_NAMESPACE_DECL))
		    {
			xmlXPathNodeSetFreeNs((xmlNsPtr) node);
		    }
		}
	    } else if (tmpset->nodeNr == 1) {
		if ((tmpset->nodeTab[0] != NULL) &&
		    (tmpset->nodeTab[0]->type == XML_NAMESPACE_DECL))
		    xmlXPathNodeSetFreeNs((xmlNsPtr) tmpset->nodeTab[0]);
	    }
	    tmpset->nodeNr = 0;
	    memset(obj, 0, sizeof(xmlXPathObject));
	    obj->nodesetval = tmpset;
	} else
	    memset(obj, 0, sizeof(xmlXPathObject));

	return;

free_obj:
	/*
	* Cache is full; free the object.
	*/
	if (obj->nodesetval != NULL)
	    xmlXPathFreeNodeSet(obj->nodesetval);
#ifdef XP_DEBUG_OBJ_USAGE
	xmlXPathDebugObjUsageReleased(NULL, obj->type);
#endif
	xmlFree(obj);
    }
    return;
}